

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_serializer.cpp
# Opt level: O3

void __thiscall Serializer_Operator2_Test::TestBody(Serializer_Operator2_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *message;
  AssertionResult gtest_ar;
  Serializer builder;
  ByteData256 local_80;
  string local_68;
  internal local_48 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  Serializer local_38;
  
  cfd::core::Serializer::Serializer(&local_38);
  cfd::core::Serializer::operator<<(&local_38,2);
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"00020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4",
             "");
  cfd::core::ByteData256::ByteData256(&local_80,&local_68);
  cfd::core::Serializer::operator<<(&local_38,&local_80);
  if (local_80.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  cfd::core::Serializer::Output((ByteData *)&local_80,&local_38);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_68,(ByteData *)&local_80);
  testing::internal::CmpHelperEQ<char[81],std::__cxx11::string>
            (local_48,
             "\"020000000000000000020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4\"",
             "builder.Output().GetHex()",
             (char (*) [81])
             "020000000000000000020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4",
             &local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (local_80.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_serializer.cpp"
               ,0x33,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_68._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_38._vptr_Serializer = (_func_int **)&PTR__Serializer_0067a778;
  if (local_38.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(Serializer, Operator2) {
  Serializer builder;
  builder << int64_t{2};
  builder << ByteData256("00020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4");

  EXPECT_EQ("020000000000000000020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4",
      builder.Output().GetHex());
}